

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::Number> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Number>(RecursiveDescentParser *this)

{
  string *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Number> sVar2;
  int64_t val;
  istringstream in;
  ostringstream out;
  long local_340;
  long *local_338 [2];
  long local_328 [2];
  string local_318;
  byte abStack_2f8 [88];
  ios_base local_2a0 [264];
  string local_198 [3];
  ios_base local_128 [264];
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Number,std::allocator<MyCompiler::Number>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Number **)this,
             (allocator<MyCompiler::Number> *)&local_318);
  if (in_RSI->sym != NUMBER) {
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"number expected","");
    except(in_RSI,NUMBER,&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
  }
  psVar1 = Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_318,(string *)psVar1,_S_in);
  *(uint *)(abStack_2f8 + *(long *)(local_318._M_dataplus._M_p + -0x18) + -8) =
       *(uint *)(abStack_2f8 + *(long *)(local_318._M_dataplus._M_p + -0x18) + -8) & 0xfffffdff;
  *(uint *)(abStack_2f8 + *(long *)(local_318._M_dataplus._M_p + -0x18) + -8) =
       *(uint *)(abStack_2f8 + *(long *)(local_318._M_dataplus._M_p + -0x18) + -8) & 0xffffffb5 | 2;
  std::istream::_M_extract<long>((long *)&local_318);
  if (((abStack_2f8[*(long *)(local_318._M_dataplus._M_p + -0x18)] & 5) != 0) ||
     ((int)local_340 != local_340)) {
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"this number is too large","");
    except(in_RSI,NUMBER,local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
      operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
    }
  }
  Number::setNum((Number *)this->stream,local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::_M_insert<long>((long)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)(this->stream + 0x28),(string *)local_338);
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  nextSym(in_RSI);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_318);
  std::ios_base::~ios_base(local_2a0);
  sVar2.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Number>)
         sVar2.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Number> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Number>();

    if (sym != SymbolType::NUMBER)
        except(SymbolType::NUMBER, "number expected");
    int64_t val;
    std::istringstream in(currentToken.getValue());
    in >> std::noshowbase >> std::setbase(10) >> val;
    if (in.fail() || val > std::numeric_limits<int32_t>::max() || val < std::numeric_limits<int32_t>::min())
        except(SymbolType::NUMBER, "this number is too large");
    pResult->setNum(val);
    std::ostringstream out;
    out << val;
    pResult->value = out.str();
    accept(sym);

    return pResult;
}